

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O2

uint64_t to_msr_tw_atom(double seconds,double time_units)

{
  ulong uVar1;
  double dVar2;
  uint64_t uStack_30;
  
  if (seconds <= 0.0) {
    __assert_fail("seconds > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0xcf,"uint64_t to_msr_tw_atom(double, double)");
  }
  if (0.0 < time_units) {
    if (seconds < 1.0) {
      uStack_30 = 0;
      fprintf(_stderr,"%s [%s] ","[WARN] ","raplcap-msr");
      fprintf(_stderr,"Time window too small: %.12f sec, using min: %.12f sec\n",seconds,
              0x3ff0000000000000);
    }
    else if (127.0 < seconds / time_units) {
      fprintf(_stderr,"%s [%s] ","[WARN] ","raplcap-msr");
      fprintf(_stderr,"Time window too large: %.12f sec, using max: %.12f sec\n",seconds,
              time_units * 127.0);
      uStack_30 = 0x7f;
    }
    else {
      dVar2 = seconds / time_units + 0.5;
      uVar1 = (ulong)dVar2;
      uStack_30 = (long)(dVar2 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1;
    }
    return uStack_30;
  }
  __assert_fail("time_units > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                ,0xd0,"uint64_t to_msr_tw_atom(double, double)");
}

Assistant:

static uint64_t to_msr_tw_atom(double seconds, double time_units) {
  assert(seconds > 0);
  assert(time_units > 0);
  // time_units should be 1.0, but conceivably could be any whole number in 4 bit range: [1, 15]
  static const uint64_t MSR_TIME_MAX = 0x7F;
  const double t = seconds / time_units;
  uint64_t bits;
  if (seconds < 1) {
    raplcap_log(WARN, "Time window too small: %.12f sec, using min: %.12f sec\n", seconds, 1.0);
    bits = 0x0; // interpreted as 1 second
  } else if (t > (double) MSR_TIME_MAX) {
    raplcap_log(WARN, "Time window too large: %.12f sec, using max: %.12f sec\n", seconds, MSR_TIME_MAX * time_units);
    bits = MSR_TIME_MAX;
  } else {
    // round to nearest MSR value ((s + u/2) / u)
    bits = (uint64_t) (t + 0.5);
  }
  raplcap_log(DEBUG, "to_msr_tw_atom: seconds=%.12f, bits=0x%02lX\n", seconds, bits);
  return bits;
}